

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O1

void iterator_manual_wal_flush(void)

{
  fdb_encryption_key *pfVar1;
  fdb_kvs_handle *pfVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  fdb_file_handle **ptr_fhandle;
  btree *ptr_fhandle_00;
  fdb_kvs_handle *pfVar8;
  fdb_kvs_handle **ptr_iterator;
  fdb_config **ptr_iterator_00;
  ulong uVar9;
  fdb_kvs_handle **ppfVar10;
  fdb_iterator **ptr_iterator_01;
  fdb_config *pfVar11;
  uint uVar12;
  int delete_opt;
  fdb_kvs_handle *pfVar13;
  fdb_doc **doc;
  char *pcVar14;
  long lVar15;
  fdb_config *pfVar16;
  char *doc_00;
  fdb_iterator *it;
  fdb_kvs_handle *db2;
  uchar start_key2 [11];
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  uchar start_key1 [11];
  uchar key1 [15];
  uchar key2 [17];
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_iterator *pfStack_3938;
  fdb_kvs_handle *pfStack_3930;
  fdb_file_handle *pfStack_3928;
  fdb_doc *pfStack_3920;
  fdb_kvs_config fStack_3918;
  timeval tStack_3900;
  fdb_config fStack_38f0;
  fdb_config *pfStack_37f8;
  fdb_iterator *pfStack_37e0;
  fdb_kvs_handle *pfStack_37d8;
  fdb_doc *pfStack_37d0;
  fdb_file_handle *pfStack_37c8;
  fdb_kvs_config fStack_37c0;
  timeval tStack_37a8;
  fdb_config fStack_3798;
  fdb_config *pfStack_36a0;
  fdb_iterator *pfStack_3688;
  fdb_kvs_handle *pfStack_3680;
  fdb_file_handle *pfStack_3678;
  fdb_doc *pfStack_3670;
  uint64_t uStack_3668;
  undefined1 uStack_3660;
  undefined7 uStack_3658;
  undefined4 uStack_3651;
  undefined8 uStack_3648;
  undefined7 uStack_3640;
  undefined4 uStack_3639;
  fdb_kvs_config fStack_3630;
  timeval tStack_3618;
  undefined4 uStack_3608;
  undefined1 uStack_3604;
  fdb_config fStack_3500;
  char acStack_3408 [256];
  fdb_config *pfStack_3308;
  char *pcStack_3300;
  code *pcStack_32f8;
  fdb_doc *pfStack_32e0;
  fdb_iterator *pfStack_32d8;
  fdb_kvs_handle *pfStack_32d0;
  fdb_file_handle *pfStack_32c8;
  fdb_kvs_config fStack_32c0;
  timeval tStack_32a8;
  fdb_config fStack_3298;
  fdb_iterator **ppfStack_31a0;
  fdb_iterator *pfStack_3188;
  fdb_doc *pfStack_3180;
  fdb_kvs_handle *pfStack_3178;
  fdb_file_handle *pfStack_3170;
  timeval tStack_3168;
  fdb_iterator *apfStack_3158 [33];
  fdb_kvs_config fStack_3050;
  char acStack_3038 [264];
  fdb_config fStack_2f30;
  char acStack_2e38 [256];
  fdb_kvs_handle *pfStack_2d38;
  fdb_kvs_handle *pfStack_2d30;
  fdb_doc **ppfStack_2d28;
  fdb_doc **ppfStack_2d20;
  fdb_doc **ppfStack_2d18;
  fdb_kvs_handle *pfStack_2d00;
  fdb_file_handle *pfStack_2cf8;
  fdb_iterator *pfStack_2cf0;
  fdb_doc *pfStack_2ce8;
  fdb_kvs_handle *pfStack_2ce0;
  fdb_kvs_config fStack_2cd8;
  timeval tStack_2cc0;
  fdb_doc *apfStack_2cb0 [32];
  undefined1 auStack_2bb0 [272];
  uint8_t auStack_2aa0 [20];
  undefined4 uStack_2a8c;
  undefined4 uStack_2a84;
  undefined1 uStack_2a7a;
  fdb_doc *apfStack_29b0 [500];
  fdb_kvs_handle afStack_1a10 [7];
  fdb_kvs_handle **ppfStack_a68;
  fdb_kvs_handle *pfStack_a60;
  fdb_doc **ppfStack_a50;
  fdb_doc **ppfStack_a48;
  fdb_doc **ppfStack_a40;
  fdb_kvs_handle *pfStack_a30;
  fdb_iterator *pfStack_a28;
  fdb_iterator *pfStack_a20;
  fdb_kvs_handle *pfStack_a18;
  fdb_file_handle *pfStack_a10;
  fdb_doc *pfStack_a08;
  fdb_file_handle *pfStack_a00;
  undefined1 auStack_9f8 [56];
  fdb_config fStack_9c0;
  fdb_doc *apfStack_8c8 [65];
  fdb_config **ppfStack_6c0;
  btree *pbStack_6b8;
  fdb_kvs_handle **ppfStack_6b0;
  fdb_config *pfStack_6a8;
  fdb_file_handle **ppfStack_6a0;
  fdb_kvs_handle *pfStack_698;
  fdb_config *pfStack_688;
  fdb_config *pfStack_680;
  fdb_kvs_handle *pfStack_678;
  fdb_file_handle *pfStack_670;
  fdb_kvs_config fStack_668;
  fdb_doc *apfStack_650 [5];
  fdb_kvs_handle *apfStack_628 [5];
  timeval tStack_600;
  fdb_kvs_handle fStack_5f0;
  fdb_config fStack_2f0;
  fdb_kvs_handle **ppfStack_1f8;
  btree *pbStack_1f0;
  fdb_kvs_handle **ppfStack_1e8;
  undefined8 *puStack_1e0;
  undefined7 *puStack_1d8;
  fdb_kvs_handle *pfStack_1d0;
  fdb_kvs_handle *local_1c0;
  fdb_kvs_handle *local_1b8;
  fdb_kvs_handle *local_1b0;
  undefined7 local_1a8;
  undefined4 uStack_1a1;
  fdb_kvs_handle *local_198;
  fdb_file_handle *local_190;
  undefined1 local_188 [16];
  undefined7 local_178;
  undefined1 uStack_171;
  undefined7 uStack_170;
  undefined8 local_168;
  void *pvStack_160;
  undefined1 local_158;
  timeval local_150;
  undefined1 local_140 [40];
  fdb_file_handle *local_118;
  undefined4 local_104;
  
  pfStack_1d0 = (fdb_kvs_handle *)0x11a6ef;
  gettimeofday(&local_150,(__timezone_ptr_t)0x0);
  pfStack_1d0 = (fdb_kvs_handle *)0x11a6f4;
  memleak_start();
  uStack_170 = 0x3106002d;
  local_178 = 0x3032343e3e0508;
  uStack_171 = 0x31;
  local_168._0_2_ = 0x508;
  local_168._2_6_ = 0x313032343e3e;
  pvStack_160 = (void *)0x323106002d31;
  local_158 = 0;
  ptr_iterator = (fdb_kvs_handle **)local_188;
  local_188._0_7_ = 0x3931343e3e0508;
  local_188._7_4_ = 0x2d3939;
  local_1a8 = 0x3433343e3e0508;
  uStack_1a1 = 0x140a35;
  local_1b8 = (fdb_kvs_handle *)0x0;
  pfStack_1d0 = (fdb_kvs_handle *)0x11a772;
  fdb_get_default_config();
  pfVar13 = (fdb_kvs_handle *)local_140;
  pfStack_1d0 = (fdb_kvs_handle *)0x11a782;
  fdb_get_default_kvs_config();
  local_118 = (fdb_file_handle *)0x400;
  local_104 = 1;
  pfStack_1d0 = (fdb_kvs_handle *)0x11a79e;
  system("rm -rf  iterator_test* > errorlog.txt");
  ptr_fhandle_00 = (btree *)&local_190;
  pfStack_1d0 = (fdb_kvs_handle *)0x11a7b5;
  fdb_open((fdb_file_handle **)ptr_fhandle_00,"./iterator_test1",(fdb_config *)(local_140 + 0x18));
  ppfVar10 = &local_198;
  pfStack_1d0 = (fdb_kvs_handle *)0x11a7d0;
  fdb_kvs_open(local_190,ppfVar10,"db1",(fdb_kvs_config *)pfVar13);
  pfStack_1d0 = (fdb_kvs_handle *)0x11a7e8;
  fdb_kvs_open(local_190,&local_1b0,"db2",(fdb_kvs_config *)pfVar13);
  pfStack_1d0 = (fdb_kvs_handle *)0x11a7fe;
  fdb_set_kv(local_198,&local_178,0xf,(void *)0x0,0);
  pfStack_1d0 = (fdb_kvs_handle *)0x11a814;
  fdb_set_kv(local_198,&local_168,0x11,(void *)0x0,0);
  pfStack_1d0 = (fdb_kvs_handle *)0x11a81f;
  fdb_commit(local_190,'\0');
  pfStack_1d0 = (fdb_kvs_handle *)0x11a842;
  pfVar8 = local_198;
  fVar3 = fdb_iterator_init(local_198,(fdb_iterator **)&local_1c0,ptr_iterator,0xb,(void *)0x0,0,0);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ab73;
  do {
    pfStack_1d0 = (fdb_kvs_handle *)0x11a85c;
    pfVar8 = local_1c0;
    fVar3 = fdb_iterator_get((fdb_iterator *)local_1c0,(fdb_doc **)&local_1b8);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pfStack_1d0 = (fdb_kvs_handle *)0x11ab69;
      iterator_manual_wal_flush();
      goto LAB_0011ab69;
    }
    pfStack_1d0 = (fdb_kvs_handle *)0x11a86e;
    fdb_doc_free((fdb_doc *)local_1b8);
    local_1b8 = (fdb_kvs_handle *)0x0;
    pfStack_1d0 = (fdb_kvs_handle *)0x11a881;
    fVar3 = fdb_iterator_next((fdb_iterator *)local_1c0);
  } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
  ptr_iterator = &local_1c0;
  pfStack_1d0 = (fdb_kvs_handle *)0x11a893;
  fdb_iterator_close((fdb_iterator *)local_1c0);
  pfStack_1d0 = (fdb_kvs_handle *)0x11a8b7;
  pfVar8 = local_198;
  fVar3 = fdb_iterator_init(local_198,(fdb_iterator **)ptr_iterator,&local_1a8,0xb,(void *)0x0,0,0);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ab78;
  pfStack_1d0 = (fdb_kvs_handle *)0x11a8ce;
  pfVar8 = local_1c0;
  fVar3 = fdb_iterator_get((fdb_iterator *)local_1c0,(fdb_doc **)&local_1b8);
  if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0011ab7d;
  ptr_iterator = &local_1c0;
  pfStack_1d0 = (fdb_kvs_handle *)0x11a8e3;
  fdb_iterator_close((fdb_iterator *)local_1c0);
  pfStack_1d0 = (fdb_kvs_handle *)0x11a8fc;
  fdb_set_kv(local_1b0,&local_178,0xf,(void *)0x0,0);
  pfStack_1d0 = (fdb_kvs_handle *)0x11a915;
  fdb_set_kv(local_1b0,&local_168,0x11,(void *)0x0,0);
  pfStack_1d0 = (fdb_kvs_handle *)0x11a924;
  fdb_commit(local_190,'\x01');
  pfStack_1d0 = (fdb_kvs_handle *)0x11a948;
  pfVar8 = local_1b0;
  fVar3 = fdb_iterator_init(local_1b0,(fdb_iterator **)ptr_iterator,local_188,0xb,(void *)0x0,0,0);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ab82;
  do {
    pfStack_1d0 = (fdb_kvs_handle *)0x11a962;
    pfVar8 = local_1c0;
    fVar3 = fdb_iterator_get((fdb_iterator *)local_1c0,(fdb_doc **)&local_1b8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ab69;
    pfStack_1d0 = (fdb_kvs_handle *)0x11a974;
    fdb_doc_free((fdb_doc *)local_1b8);
    local_1b8 = (fdb_kvs_handle *)0x0;
    pfStack_1d0 = (fdb_kvs_handle *)0x11a987;
    fVar3 = fdb_iterator_next((fdb_iterator *)local_1c0);
  } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
  ptr_iterator = &local_1c0;
  pfStack_1d0 = (fdb_kvs_handle *)0x11a999;
  fdb_iterator_close((fdb_iterator *)local_1c0);
  pfStack_1d0 = (fdb_kvs_handle *)0x11a9bd;
  pfVar8 = local_198;
  fVar3 = fdb_iterator_init(local_198,(fdb_iterator **)ptr_iterator,&local_1a8,0xb,(void *)0x0,0,0);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ab87;
  pfStack_1d0 = (fdb_kvs_handle *)0x11a9d4;
  pfVar8 = local_1c0;
  fVar3 = fdb_iterator_get((fdb_iterator *)local_1c0,(fdb_doc **)&local_1b8);
  if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0011ab8c;
  ptr_iterator = &local_1c0;
  pfStack_1d0 = (fdb_kvs_handle *)0x11a9e9;
  fdb_iterator_close((fdb_iterator *)local_1c0);
  pfStack_1d0 = (fdb_kvs_handle *)0x11aa0c;
  fVar3 = fdb_iterator_init(local_1b0,(fdb_iterator **)ptr_iterator,(void *)0x0,0,local_188,0xb,0);
  pfVar8 = local_1b0;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ab91;
  pfStack_1d0 = (fdb_kvs_handle *)0x11aa2d;
  pfVar8 = local_1c0;
  fVar3 = fdb_iterator_seek((fdb_iterator *)local_1c0,local_188,0xb,'\x01');
  if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0011ab96;
  ptr_iterator = &local_1c0;
  pfStack_1d0 = (fdb_kvs_handle *)0x11aa42;
  fdb_iterator_close((fdb_iterator *)local_1c0);
  pfStack_1d0 = (fdb_kvs_handle *)0x11aa65;
  fVar3 = fdb_iterator_init(local_198,(fdb_iterator **)ptr_iterator,(void *)0x0,0,&local_1a8,0xb,0);
  pfVar8 = local_198;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ab9b;
  pfStack_1d0 = (fdb_kvs_handle *)0x11aa86;
  pfVar8 = local_1c0;
  fVar3 = fdb_iterator_seek((fdb_iterator *)local_1c0,&local_1a8,0xb,'\x01');
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011aba0;
  pfStack_1d0 = (fdb_kvs_handle *)0x11aa9d;
  pfVar8 = local_1c0;
  fVar3 = fdb_iterator_get((fdb_iterator *)local_1c0,(fdb_doc **)&local_1b8);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_1d0 = (fdb_kvs_handle *)0x11aaaf;
    fdb_doc_free((fdb_doc *)local_1b8);
    local_1b8 = (fdb_kvs_handle *)0x0;
    pfStack_1d0 = (fdb_kvs_handle *)0x11aac2;
    fVar3 = fdb_iterator_prev((fdb_iterator *)local_1c0);
    if (fVar3 != FDB_RESULT_ITERATOR_FAIL) {
      do {
        pfStack_1d0 = (fdb_kvs_handle *)0x11aad9;
        pfVar8 = local_1c0;
        fVar3 = fdb_iterator_get((fdb_iterator *)local_1c0,(fdb_doc **)&local_1b8);
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ab6e;
        pfStack_1d0 = (fdb_kvs_handle *)0x11aaeb;
        fdb_doc_free((fdb_doc *)local_1b8);
        local_1b8 = (fdb_kvs_handle *)0x0;
        pfStack_1d0 = (fdb_kvs_handle *)0x11aafe;
        fVar3 = fdb_iterator_prev((fdb_iterator *)local_1c0);
      } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    }
    pfStack_1d0 = (fdb_kvs_handle *)0x11ab0d;
    fdb_iterator_close((fdb_iterator *)local_1c0);
    pfStack_1d0 = (fdb_kvs_handle *)0x11ab17;
    fdb_close(local_190);
    pfStack_1d0 = (fdb_kvs_handle *)0x11ab1c;
    fdb_shutdown();
    pfStack_1d0 = (fdb_kvs_handle *)0x11ab21;
    memleak_end();
    pcVar14 = "%s PASSED\n";
    if (iterator_manual_wal_flush()::__test_pass != '\0') {
      pcVar14 = "%s FAILED\n";
    }
    pfStack_1d0 = (fdb_kvs_handle *)0x11ab52;
    fprintf(_stderr,pcVar14,"iterator manual wal flush");
    return;
  }
  goto LAB_0011aba5;
LAB_0011b161:
  pfStack_698 = (fdb_kvs_handle *)0x11b16c;
  sequence_iterator_seek_test();
  pfVar16 = pfVar11;
LAB_0011b16c:
  pfVar11 = pfVar16;
  pfStack_698 = (fdb_kvs_handle *)0x11b171;
  sequence_iterator_seek_test();
LAB_0011b171:
  pfStack_698 = (fdb_kvs_handle *)0x11b17c;
  sequence_iterator_seek_test();
LAB_0011b17c:
  pfStack_698 = (fdb_kvs_handle *)0x11b187;
  sequence_iterator_seek_test();
LAB_0011b187:
  pfStack_698 = (fdb_kvs_handle *)0x11b192;
  sequence_iterator_seek_test();
  pfVar16 = pfVar11;
  goto LAB_0011b192;
LAB_0011b4b1:
  ppfVar10 = &pfStack_a30;
  ppfStack_a40 = (fdb_doc **)0x11b4b6;
  iterator_concurrent_compaction();
  goto LAB_0011b4b6;
LAB_0011b9d5:
  ppfStack_2d18 = (fdb_doc **)0x11b9da;
  iterator_offset_access_test();
LAB_0011b9da:
  ppfStack_2d18 = (fdb_doc **)0x11b9df;
  iterator_offset_access_test();
LAB_0011b9df:
  ppfStack_2d18 = (fdb_doc **)0x11b9e4;
  iterator_offset_access_test();
LAB_0011b9e4:
  ppfStack_2d18 = (fdb_doc **)0x11b9e9;
  iterator_offset_access_test();
LAB_0011b9e9:
  ppfStack_2d18 = (fdb_doc **)0x11b9ee;
  iterator_offset_access_test();
LAB_0011b9ee:
  ppfStack_2d18 = (fdb_doc **)0x11b9f3;
  iterator_offset_access_test();
LAB_0011b9f3:
  ppfStack_2d18 = (fdb_doc **)0x11b9f8;
  iterator_offset_access_test();
  goto LAB_0011b9f8;
LAB_0011ab69:
  pfStack_1d0 = (fdb_kvs_handle *)0x11ab6e;
  iterator_manual_wal_flush();
LAB_0011ab6e:
  ptr_iterator = &local_1b8;
  pfStack_1d0 = (fdb_kvs_handle *)0x11ab73;
  iterator_manual_wal_flush();
LAB_0011ab73:
  pfStack_1d0 = (fdb_kvs_handle *)0x11ab78;
  iterator_manual_wal_flush();
LAB_0011ab78:
  pfStack_1d0 = (fdb_kvs_handle *)0x11ab7d;
  iterator_manual_wal_flush();
LAB_0011ab7d:
  pfStack_1d0 = (fdb_kvs_handle *)0x11ab82;
  iterator_manual_wal_flush();
LAB_0011ab82:
  pfStack_1d0 = (fdb_kvs_handle *)0x11ab87;
  iterator_manual_wal_flush();
LAB_0011ab87:
  pfStack_1d0 = (fdb_kvs_handle *)0x11ab8c;
  iterator_manual_wal_flush();
LAB_0011ab8c:
  pfStack_1d0 = (fdb_kvs_handle *)0x11ab91;
  iterator_manual_wal_flush();
LAB_0011ab91:
  pfStack_1d0 = (fdb_kvs_handle *)0x11ab96;
  iterator_manual_wal_flush();
LAB_0011ab96:
  pfStack_1d0 = (fdb_kvs_handle *)0x11ab9b;
  iterator_manual_wal_flush();
LAB_0011ab9b:
  pfStack_1d0 = (fdb_kvs_handle *)0x11aba0;
  iterator_manual_wal_flush();
LAB_0011aba0:
  pfStack_1d0 = (fdb_kvs_handle *)0x11aba5;
  iterator_manual_wal_flush();
LAB_0011aba5:
  pfStack_1d0 = (fdb_kvs_handle *)sequence_iterator_seek_test;
  iterator_manual_wal_flush();
  ptr_iterator_00 = (fdb_config **)((ulong)pfVar8 & 0xffffffff);
  pfStack_698 = (fdb_kvs_handle *)0x11abcf;
  ppfStack_1f8 = ptr_iterator;
  pbStack_1f0 = ptr_fhandle_00;
  ppfStack_1e8 = ppfVar10;
  puStack_1e0 = &local_168;
  puStack_1d8 = &local_178;
  pfStack_1d0 = pfVar13;
  gettimeofday(&tStack_600,(__timezone_ptr_t)0x0);
  pfStack_698 = (fdb_kvs_handle *)0x11abd4;
  memleak_start();
  pfStack_680 = (fdb_config *)0x0;
  pfStack_698 = (fdb_kvs_handle *)0x11abe5;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar11 = &fStack_2f0;
  pfStack_698 = (fdb_kvs_handle *)0x11abf5;
  fdb_get_default_config();
  pfStack_698 = (fdb_kvs_handle *)0x11abff;
  fdb_get_default_kvs_config();
  fStack_2f0.buffercache_size = 0;
  fStack_2f0.wal_threshold = 0x400;
  fStack_2f0.seqtree_opt = '\x01';
  fStack_2f0.flags = 1;
  fStack_2f0.multi_kv_instances = SUB81(ptr_iterator_00,0);
  fStack_2f0.compaction_threshold = '\0';
  ptr_fhandle = &pfStack_670;
  pfStack_698 = (fdb_kvs_handle *)0x11ac38;
  fdb_open(ptr_fhandle,"./iterator_test7",pfVar11);
  if ((int)pfVar8 == 0) {
    pfStack_698 = (fdb_kvs_handle *)0x11ac66;
    fdb_kvs_open_default(pfStack_670,&pfStack_678,&fStack_668);
  }
  else {
    pfStack_698 = (fdb_kvs_handle *)0x11ac55;
    fdb_kvs_open(pfStack_670,&pfStack_678,"kv1",&fStack_668);
  }
  pfStack_698 = (fdb_kvs_handle *)0x11ac7e;
  fVar3 = fdb_set_log_callback(pfStack_678,logCallbackFunc,"sequence_iterator_seek_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    lVar15 = 0;
    uVar9 = 0;
    do {
      pfVar1 = &fStack_5f0.config.encryption_key;
      pfStack_698 = (fdb_kvs_handle *)0x11aca6;
      sprintf((char *)pfVar1,"key%d",uVar9 & 0xffffffff);
      pfStack_698 = (fdb_kvs_handle *)0x11acbe;
      sprintf((char *)&fStack_5f0.bub_ctx.handle,"meta%d",uVar9 & 0xffffffff);
      pfStack_698 = (fdb_kvs_handle *)0x11acd6;
      sprintf((char *)&fStack_5f0,"body%d",uVar9 & 0xffffffff);
      pfStack_698 = (fdb_kvs_handle *)0x11ace6;
      sVar5 = strlen((char *)pfVar1);
      ppfVar10 = &fStack_5f0.bub_ctx.handle;
      pfStack_698 = (fdb_kvs_handle *)0x11acf9;
      sVar6 = strlen((char *)ppfVar10);
      pfStack_698 = (fdb_kvs_handle *)0x11ad09;
      sVar7 = strlen((char *)&fStack_5f0);
      pfStack_698 = (fdb_kvs_handle *)0x11ad2e;
      fdb_doc_create((fdb_doc **)((long)apfStack_650 + lVar15),&fStack_5f0.config.encryption_key,
                     sVar5,ppfVar10,sVar6,&fStack_5f0,sVar7);
      pfStack_698 = (fdb_kvs_handle *)0x11ad3d;
      fdb_set(pfStack_678,apfStack_650[uVar9]);
      uVar9 = uVar9 + 1;
      lVar15 = lVar15 + 8;
    } while (uVar9 != 5);
    pfStack_698 = (fdb_kvs_handle *)0x11ad5d;
    fdb_commit(pfStack_670,'\x01');
    uVar9 = 5;
    pfVar11 = (fdb_config *)apfStack_628;
    do {
      pfVar1 = &fStack_5f0.config.encryption_key;
      pfStack_698 = (fdb_kvs_handle *)0x11ad82;
      sprintf((char *)pfVar1,"key%d",uVar9 & 0xffffffff);
      ppfVar10 = &fStack_5f0.bub_ctx.handle;
      pfStack_698 = (fdb_kvs_handle *)0x11ad9d;
      sprintf((char *)ppfVar10,"meta%d",uVar9 & 0xffffffff);
      pfVar13 = &fStack_5f0;
      pfStack_698 = (fdb_kvs_handle *)0x11adb8;
      sprintf((char *)pfVar13,"body%d",uVar9 & 0xffffffff);
      pfStack_698 = (fdb_kvs_handle *)0x11adc0;
      ptr_fhandle = (fdb_file_handle **)strlen((char *)pfVar1);
      pfStack_698 = (fdb_kvs_handle *)0x11adcb;
      ptr_fhandle_00 = (btree *)strlen((char *)ppfVar10);
      pfStack_698 = (fdb_kvs_handle *)0x11add6;
      sVar5 = strlen((char *)pfVar13);
      pfStack_698 = (fdb_kvs_handle *)0x11adf6;
      fdb_doc_create((fdb_doc **)pfVar11,&fStack_5f0.config.encryption_key,(size_t)ptr_fhandle,
                     ppfVar10,(size_t)ptr_fhandle_00,pfVar13,sVar5);
      pfStack_698 = (fdb_kvs_handle *)0x11ae03;
      fdb_set(pfStack_678,(fdb_doc *)*(fdb_kvs_handle **)pfVar11);
      uVar9 = uVar9 + 1;
      pfVar11 = (fdb_config *)((long)pfVar11 + 8);
    } while (uVar9 != 10);
    pfStack_698 = (fdb_kvs_handle *)0x11ae20;
    fdb_commit(pfStack_670,'\0');
    ptr_iterator_00 = &pfStack_688;
    pfStack_698 = (fdb_kvs_handle *)0x11ae39;
    fdb_iterator_sequence_init(pfStack_678,(fdb_iterator **)ptr_iterator_00,0,0,0);
    pfStack_698 = (fdb_kvs_handle *)0x11ae41;
    fVar3 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_688);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b1b2;
    ppfVar10 = apfStack_628 + 4;
    pfVar16 = pfVar11;
    do {
      pfStack_698 = (fdb_kvs_handle *)0x11ae63;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_688,(fdb_doc **)&pfStack_680);
      pfVar11 = pfStack_680;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_0011b146:
        pfStack_698 = (fdb_kvs_handle *)0x11b14b;
        sequence_iterator_seek_test();
        pfVar11 = pfVar16;
LAB_0011b14b:
        pfStack_698 = (fdb_kvs_handle *)0x11b156;
        sequence_iterator_seek_test();
LAB_0011b156:
        pfStack_698 = (fdb_kvs_handle *)0x11b161;
        sequence_iterator_seek_test();
        goto LAB_0011b161;
      }
      sVar5._0_2_ = pfStack_680->chunksize;
      sVar5._2_2_ = *(undefined2 *)&pfStack_680->field_0x2;
      sVar5._4_4_ = pfStack_680->blocksize;
      ptr_fhandle = *(fdb_file_handle ***)&pfStack_680->seqtree_opt;
      pfVar13 = *ppfVar10;
      ptr_fhandle_00 = (btree *)pfVar13->op_stats;
      pfStack_698 = (fdb_kvs_handle *)0x11ae8a;
      iVar4 = bcmp(ptr_fhandle,ptr_fhandle_00,sVar5);
      pfVar16 = pfVar11;
      if (iVar4 != 0) {
        pfStack_698 = (fdb_kvs_handle *)0x11b146;
        sequence_iterator_seek_test();
        goto LAB_0011b146;
      }
      ptr_fhandle = (fdb_file_handle **)pfVar11->compactor_sleep_duration;
      ptr_fhandle_00 = pfVar13->staletree;
      pfStack_698 = (fdb_kvs_handle *)0x11aea9;
      iVar4 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar11->buffercache_size);
      if (iVar4 != 0) goto LAB_0011b156;
      ptr_fhandle = *(fdb_file_handle ***)&pfVar11->multi_kv_instances;
      ptr_fhandle_00 = (pfVar13->field_6).seqtree;
      pfStack_698 = (fdb_kvs_handle *)0x11aec8;
      iVar4 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar11->wal_threshold);
      if (iVar4 != 0) goto LAB_0011b14b;
      pfStack_698 = (fdb_kvs_handle *)0x11aed8;
      fdb_doc_free((fdb_doc *)pfVar11);
      pfStack_680 = (fdb_config *)0x0;
      pfStack_698 = (fdb_kvs_handle *)0x11aeeb;
      fVar3 = fdb_iterator_prev((fdb_iterator *)pfStack_688);
      ppfVar10 = ppfVar10 + -1;
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator_00 = &pfStack_688;
    pfStack_698 = (fdb_kvs_handle *)0x11af05;
    fdb_iterator_close((fdb_iterator *)pfStack_688);
    pfStack_698 = (fdb_kvs_handle *)0x11af1c;
    fdb_iterator_sequence_init(pfStack_678,(fdb_iterator **)ptr_iterator_00,0,7,0);
    pfStack_698 = (fdb_kvs_handle *)0x11af24;
    fVar3 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_688);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b1b7;
    ppfVar10 = apfStack_628 + 1;
    do {
      pfStack_698 = (fdb_kvs_handle *)0x11af43;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_688,(fdb_doc **)&pfStack_680);
      pfVar11 = pfStack_680;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b16c;
      sVar6._0_2_ = pfStack_680->chunksize;
      sVar6._2_2_ = *(undefined2 *)&pfStack_680->field_0x2;
      sVar6._4_4_ = pfStack_680->blocksize;
      ptr_fhandle = *(fdb_file_handle ***)&pfStack_680->seqtree_opt;
      pfVar13 = *ppfVar10;
      ptr_fhandle_00 = (btree *)pfVar13->op_stats;
      pfStack_698 = (fdb_kvs_handle *)0x11af6a;
      iVar4 = bcmp(ptr_fhandle,ptr_fhandle_00,sVar6);
      if (iVar4 != 0) goto LAB_0011b161;
      ptr_fhandle = (fdb_file_handle **)pfVar11->compactor_sleep_duration;
      ptr_fhandle_00 = pfVar13->staletree;
      pfStack_698 = (fdb_kvs_handle *)0x11af89;
      iVar4 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar11->buffercache_size);
      if (iVar4 != 0) goto LAB_0011b17c;
      ptr_fhandle = *(fdb_file_handle ***)&pfVar11->multi_kv_instances;
      ptr_fhandle_00 = (pfVar13->field_6).seqtree;
      pfStack_698 = (fdb_kvs_handle *)0x11afa8;
      iVar4 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar11->wal_threshold);
      if (iVar4 != 0) goto LAB_0011b171;
      pfStack_698 = (fdb_kvs_handle *)0x11afb8;
      fdb_doc_free((fdb_doc *)pfVar11);
      pfStack_680 = (fdb_config *)0x0;
      pfStack_698 = (fdb_kvs_handle *)0x11afcb;
      fVar3 = fdb_iterator_prev((fdb_iterator *)pfStack_688);
      ppfVar10 = ppfVar10 + -1;
      pfVar16 = pfVar11;
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator_00 = &pfStack_688;
    pfStack_698 = (fdb_kvs_handle *)0x11afe5;
    fdb_iterator_close((fdb_iterator *)pfStack_688);
    pfStack_698 = (fdb_kvs_handle *)0x11afff;
    fdb_iterator_sequence_init(pfStack_678,(fdb_iterator **)ptr_iterator_00,0,7,8);
    pfStack_698 = (fdb_kvs_handle *)0x11b007;
    fVar3 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_688);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      ppfVar10 = apfStack_628;
      while( true ) {
        pfStack_698 = (fdb_kvs_handle *)0x11b026;
        fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_688,(fdb_doc **)&pfStack_680);
        pfVar11 = pfStack_680;
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sVar7._0_2_ = pfStack_680->chunksize;
        sVar7._2_2_ = *(undefined2 *)&pfStack_680->field_0x2;
        sVar7._4_4_ = pfStack_680->blocksize;
        ptr_fhandle = *(fdb_file_handle ***)&pfStack_680->seqtree_opt;
        pfVar13 = *ppfVar10;
        ptr_fhandle_00 = (btree *)pfVar13->op_stats;
        pfStack_698 = (fdb_kvs_handle *)0x11b04d;
        iVar4 = bcmp(ptr_fhandle,ptr_fhandle_00,sVar7);
        if (iVar4 != 0) goto LAB_0011b187;
        ptr_fhandle = (fdb_file_handle **)pfVar11->compactor_sleep_duration;
        ptr_fhandle_00 = pfVar13->staletree;
        pfStack_698 = (fdb_kvs_handle *)0x11b06c;
        iVar4 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar11->buffercache_size);
        if (iVar4 != 0) goto LAB_0011b1a2;
        ptr_fhandle = *(fdb_file_handle ***)&pfVar11->multi_kv_instances;
        ptr_fhandle_00 = (pfVar13->field_6).seqtree;
        pfStack_698 = (fdb_kvs_handle *)0x11b08b;
        iVar4 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar11->wal_threshold);
        if (iVar4 != 0) goto LAB_0011b197;
        pfStack_698 = (fdb_kvs_handle *)0x11b09b;
        fdb_doc_free((fdb_doc *)pfVar11);
        pfStack_680 = (fdb_config *)0x0;
        pfStack_698 = (fdb_kvs_handle *)0x11b0ae;
        fVar3 = fdb_iterator_prev((fdb_iterator *)pfStack_688);
        ppfVar10 = ppfVar10 + -1;
        pfVar16 = pfVar11;
        if (fVar3 == FDB_RESULT_ITERATOR_FAIL) {
          pfStack_698 = (fdb_kvs_handle *)0x11b0c5;
          fdb_iterator_close((fdb_iterator *)pfStack_688);
          pfStack_698 = (fdb_kvs_handle *)0x11b0cf;
          fdb_kvs_close(pfStack_678);
          pfStack_698 = (fdb_kvs_handle *)0x11b0d9;
          fdb_close(pfStack_670);
          lVar15 = 0;
          do {
            pfStack_698 = (fdb_kvs_handle *)0x11b0e5;
            fdb_doc_free(apfStack_650[lVar15]);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 10);
          pfStack_698 = (fdb_kvs_handle *)0x11b0f3;
          fdb_shutdown();
          pfStack_698 = (fdb_kvs_handle *)0x11b0f8;
          memleak_end();
          pcVar14 = "%s PASSED\n";
          if (sequence_iterator_seek_test(bool)::__test_pass != '\0') {
            pcVar14 = "%s FAILED\n";
          }
          pfStack_698 = (fdb_kvs_handle *)0x11b129;
          fprintf(_stderr,pcVar14,"sequence iterator seek test");
          return;
        }
      }
LAB_0011b192:
      pfVar11 = pfVar16;
      pfStack_698 = (fdb_kvs_handle *)0x11b197;
      sequence_iterator_seek_test();
LAB_0011b197:
      pfStack_698 = (fdb_kvs_handle *)0x11b1a2;
      sequence_iterator_seek_test();
LAB_0011b1a2:
      ptr_iterator_00 = &pfStack_680;
      pfStack_698 = (fdb_kvs_handle *)0x11b1ad;
      sequence_iterator_seek_test();
      goto LAB_0011b1ad;
    }
  }
  else {
LAB_0011b1ad:
    pfStack_698 = (fdb_kvs_handle *)0x11b1b2;
    sequence_iterator_seek_test();
LAB_0011b1b2:
    pfStack_698 = (fdb_kvs_handle *)0x11b1b7;
    sequence_iterator_seek_test();
LAB_0011b1b7:
    pfStack_698 = (fdb_kvs_handle *)0x11b1bc;
    sequence_iterator_seek_test();
  }
  pfStack_698 = (fdb_kvs_handle *)iterator_concurrent_compaction;
  sequence_iterator_seek_test();
  ppfStack_a40 = (fdb_doc **)0x11b1de;
  ppfStack_6c0 = ptr_iterator_00;
  pbStack_6b8 = ptr_fhandle_00;
  ppfStack_6b0 = ppfVar10;
  pfStack_6a8 = pfVar11;
  ppfStack_6a0 = ptr_fhandle;
  pfStack_698 = pfVar13;
  gettimeofday((timeval *)(auStack_9f8 + 0x28),(__timezone_ptr_t)0x0);
  ppfStack_a40 = (fdb_doc **)0x11b1e3;
  memleak_start();
  pfStack_a30 = (fdb_kvs_handle *)0x0;
  ppfStack_a40 = (fdb_doc **)0x11b1f9;
  fdb_get_default_config();
  ppfStack_a40 = (fdb_doc **)0x11b206;
  fdb_get_default_kvs_config();
  fStack_9c0.wal_threshold = 0x400;
  fStack_9c0.seqtree_opt = '\x01';
  fStack_9c0.flags = 1;
  ppfStack_a40 = (fdb_doc **)0x11b225;
  system("rm -rf  iterator_test* > errorlog.txt");
  ppfStack_a40 = (fdb_doc **)0x11b23c;
  fdb_open(&pfStack_a10,"./iterator_test1",&fStack_9c0);
  ppfStack_a40 = (fdb_doc **)0x11b253;
  fdb_kvs_open(pfStack_a10,&pfStack_a18,"db",(fdb_kvs_config *)(auStack_9f8 + 0x10));
  pcVar14 = "body%d";
  pfVar13 = (fdb_kvs_handle *)(apfStack_8c8 + 0x20);
  doc = (fdb_doc **)0x0;
  do {
    ppfStack_a40 = (fdb_doc **)0x11b27f;
    sprintf((char *)apfStack_8c8,"key%d",doc);
    ppfStack_a40 = (fdb_doc **)0x11b28e;
    sprintf((char *)pfVar13,"body%d",doc);
    pfVar8 = pfStack_a18;
    ppfStack_a40 = (fdb_doc **)0x11b29b;
    sVar5 = strlen((char *)apfStack_8c8);
    ppfStack_a40 = (fdb_doc **)0x11b2a6;
    sVar6 = strlen((char *)pfVar13);
    ppfStack_a40 = (fdb_doc **)0x11b2ba;
    fdb_set_kv(pfVar8,apfStack_8c8,sVar5,pfVar13,sVar6);
    uVar12 = (int)doc + 1;
    doc = (fdb_doc **)(ulong)uVar12;
  } while (uVar12 != 10);
  ppfStack_a40 = (fdb_doc **)0x11b2cd;
  fdb_commit(pfStack_a10,'\0');
  ppfStack_a40 = (fdb_doc **)0x11b2e6;
  fdb_open(&pfStack_a00,"./iterator_test1",&fStack_9c0);
  ppfVar10 = (fdb_kvs_handle **)(auStack_9f8 + 8);
  ppfStack_a40 = (fdb_doc **)0x11b302;
  fdb_kvs_open(pfStack_a00,ppfVar10,"db",(fdb_kvs_config *)(auStack_9f8 + 0x10));
  ppfStack_a40 = (fdb_doc **)0x11b313;
  fdb_compact(pfStack_a10,"./iterator_test2");
  ppfStack_a40 = (fdb_doc **)0x11b331;
  fVar3 = fdb_iterator_init((fdb_kvs_handle *)auStack_9f8._8_8_,&pfStack_a20,(void *)0x0,0,
                            (void *)0x0,0,0);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfStack_a40 = (fdb_doc **)0x11b34f;
    fVar3 = fdb_iterator_sequence_init(pfStack_a18,&pfStack_a28,0,0,0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b4bb;
    pcVar14 = (char *)&pfStack_a08;
    pfVar13 = (fdb_kvs_handle *)auStack_9f8;
    doc = (fdb_doc **)0x0;
    do {
      ppfStack_a40 = (fdb_doc **)0x11b381;
      sprintf((char *)apfStack_8c8,"key%d",doc);
      pfVar8 = pfStack_a18;
      ppfStack_a40 = (fdb_doc **)0x11b38e;
      sVar5 = strlen((char *)apfStack_8c8);
      ppfStack_a40 = (fdb_doc **)0x11b3a2;
      fdb_get_kv(pfVar8,apfStack_8c8,sVar5,(void **)pcVar14,(size_t *)pfVar13);
      ppfStack_a40 = (fdb_doc **)0x11b3ac;
      fdb_free_block(pfStack_a08);
      uVar12 = (int)doc + 1;
      doc = (fdb_doc **)(ulong)uVar12;
    } while (uVar12 != 10);
    ppfVar10 = &pfStack_a30;
    do {
      pfStack_a30 = (fdb_kvs_handle *)0x0;
      ppfStack_a40 = (fdb_doc **)0x11b3ce;
      fVar3 = fdb_iterator_get(pfStack_a20,(fdb_doc **)ppfVar10);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        ppfStack_a40 = (fdb_doc **)0x11b4b1;
        iterator_concurrent_compaction();
        goto LAB_0011b4b1;
      }
      ppfStack_a40 = (fdb_doc **)0x11b3e0;
      fdb_doc_free((fdb_doc *)pfStack_a30);
      ppfStack_a40 = (fdb_doc **)0x11b3ea;
      fVar3 = fdb_iterator_next(pfStack_a20);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    ppfStack_a40 = (fdb_doc **)0x11b3f9;
    fVar3 = fdb_iterator_close(pfStack_a20);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b4c0;
    ppfVar10 = &pfStack_a30;
    do {
      pfStack_a30 = (fdb_kvs_handle *)0x0;
      ppfStack_a40 = (fdb_doc **)0x11b41c;
      fVar3 = fdb_iterator_get(pfStack_a28,(fdb_doc **)ppfVar10);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b4b1;
      ppfStack_a40 = (fdb_doc **)0x11b42e;
      fdb_doc_free((fdb_doc *)pfStack_a30);
      ppfStack_a40 = (fdb_doc **)0x11b438;
      fVar3 = fdb_iterator_next(pfStack_a28);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    ppfStack_a40 = (fdb_doc **)0x11b447;
    fVar3 = fdb_iterator_close(pfStack_a28);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      ppfStack_a40 = (fdb_doc **)0x11b455;
      fdb_close(pfStack_a10);
      ppfStack_a40 = (fdb_doc **)0x11b45f;
      fdb_close(pfStack_a00);
      ppfStack_a40 = (fdb_doc **)0x11b464;
      fdb_shutdown();
      ppfStack_a40 = (fdb_doc **)0x11b469;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (iterator_concurrent_compaction()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      ppfStack_a40 = (fdb_doc **)0x11b49a;
      fprintf(_stderr,pcVar14,"iterator with concurrent compaction test");
      return;
    }
  }
  else {
LAB_0011b4b6:
    ppfStack_a40 = (fdb_doc **)0x11b4bb;
    iterator_concurrent_compaction();
LAB_0011b4bb:
    ppfStack_a40 = (fdb_doc **)0x11b4c0;
    iterator_concurrent_compaction();
LAB_0011b4c0:
    ppfStack_a40 = (fdb_doc **)0x11b4c5;
    iterator_concurrent_compaction();
  }
  doc_00 = (char *)apfStack_8c8;
  ppfStack_a40 = (fdb_doc **)iterator_offset_access_test;
  iterator_concurrent_compaction();
  ppfStack_2d18 = (fdb_doc **)0x11b4e7;
  ppfStack_a68 = ppfVar10;
  pfStack_a60 = pfVar13;
  ppfStack_a50 = (fdb_doc **)doc_00;
  ppfStack_a48 = (fdb_doc **)pcVar14;
  ppfStack_a40 = doc;
  gettimeofday(&tStack_2cc0,(__timezone_ptr_t)0x0);
  ppfStack_2d18 = (fdb_doc **)0x11b4ec;
  memleak_start();
  pfStack_2ce8 = (fdb_doc *)0x0;
  ppfStack_2d18 = (fdb_doc **)0x11b501;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar8 = (fdb_kvs_handle *)(auStack_2bb0 + 0x108);
  ppfStack_2d18 = (fdb_doc **)0x11b511;
  fdb_get_default_config();
  ppfStack_2d18 = (fdb_doc **)0x11b51b;
  fdb_get_default_kvs_config();
  auStack_2aa0[8] = '\0';
  auStack_2aa0[9] = '\x02';
  auStack_2aa0[10] = '\0';
  auStack_2aa0[0xb] = '\0';
  auStack_2aa0[0xc] = '\0';
  auStack_2aa0[0xd] = '\0';
  auStack_2aa0[0xe] = '\0';
  auStack_2aa0[0xf] = '\0';
  auStack_2aa0[0] = '\0';
  auStack_2aa0[1] = '\x10';
  auStack_2aa0[2] = '\0';
  auStack_2aa0[3] = '\0';
  auStack_2aa0[4] = '\0';
  auStack_2aa0[5] = '\0';
  auStack_2aa0[6] = '\0';
  auStack_2aa0[7] = '\0';
  uStack_2a84 = 1;
  uStack_2a7a = 0;
  uStack_2a8c = 1;
  ppfStack_2d18 = (fdb_doc **)0x11b54e;
  fVar3 = fdb_open(&pfStack_2cf8,"./iterator_test1",(fdb_config *)pfVar8);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfStack_2d18 = (fdb_doc **)0x11b571;
    fVar3 = fdb_kvs_open(pfStack_2cf8,&pfStack_2d00,"DB",&fStack_2cd8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ba02;
    ppfStack_2d18 = (fdb_doc **)0x11b594;
    fVar3 = fdb_kvs_open(pfStack_2cf8,&pfStack_2ce0,"ODB",&fStack_2cd8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ba07;
    doc_00 = (char *)apfStack_2cb0;
    pfVar13 = (fdb_kvs_handle *)auStack_2bb0;
    pcVar14 = (char *)0x0;
    uVar9 = 0;
    do {
      ppfStack_2d18 = (fdb_doc **)0x11b5c3;
      sprintf(doc_00,"key%d",uVar9 & 0xffffffff);
      ppfStack_2d18 = (fdb_doc **)0x11b5d7;
      sprintf((char *)pfVar13,"body%d",uVar9 & 0xffffffff);
      doc = (fdb_doc **)((long)apfStack_29b0 + (long)pcVar14);
      ppfStack_2d18 = (fdb_doc **)0x11b5ea;
      pfVar8 = (fdb_kvs_handle *)strlen(doc_00);
      ppfStack_2d18 = (fdb_doc **)0x11b5f5;
      sVar5 = strlen((char *)pfVar13);
      ppfStack_2d18 = (fdb_doc **)0x11b60f;
      fdb_doc_create(doc,doc_00,(size_t)pfVar8,(void *)0x0,0,pfVar13,sVar5);
      ppfStack_2d18 = (fdb_doc **)0x11b621;
      fVar3 = fdb_set(pfStack_2d00,apfStack_29b0[uVar9]);
      pfVar2 = pfStack_2ce0;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_0011b9d0:
        ppfStack_2d18 = (fdb_doc **)0x11b9d5;
        iterator_offset_access_test();
        goto LAB_0011b9d5;
      }
      ppfStack_2d18 = (fdb_doc **)0x11b636;
      sVar5 = strlen(doc_00);
      ppfStack_2d18 = (fdb_doc **)0x11b656;
      fVar3 = fdb_set_kv(pfVar2,doc_00,sVar5,&apfStack_29b0[uVar9]->offset,8);
      pfVar8 = pfVar2;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        ppfStack_2d18 = (fdb_doc **)0x11b9d0;
        iterator_offset_access_test();
        goto LAB_0011b9d0;
      }
      uVar9 = uVar9 + 1;
      pcVar14 = (char *)((long)pcVar14 + 8);
    } while (uVar9 != 1000);
    ppfStack_2d18 = (fdb_doc **)0x11b681;
    fVar3 = fdb_commit(pfStack_2cf8,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ba0c;
    pfVar8 = (fdb_kvs_handle *)0xfa;
    doc_00 = "key%d";
    pcVar14 = (char *)apfStack_2cb0;
    do {
      ppfStack_2d18 = (fdb_doc **)0x11b6a9;
      sprintf(pcVar14,"key%d",pfVar8);
      pfVar13 = pfStack_2d00;
      ppfStack_2d18 = (fdb_doc **)0x11b6b6;
      sVar5 = strlen(pcVar14);
      ppfStack_2d18 = (fdb_doc **)0x11b6c4;
      fVar3 = fdb_del_kv(pfVar13,pcVar14,sVar5);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b9d5;
      uVar12 = (int)pfVar8 + 1;
      pfVar8 = (fdb_kvs_handle *)(ulong)uVar12;
    } while (uVar12 != 500);
    doc_00 = (char *)apfStack_2cb0;
    pfVar13 = (fdb_kvs_handle *)auStack_2bb0;
    pcVar14 = (char *)0x0;
    uVar9 = 0;
    do {
      ppfStack_2d18 = (fdb_doc **)0x11b6fd;
      sprintf(doc_00,"k0y%d",uVar9 & 0xffffffff);
      ppfStack_2d18 = (fdb_doc **)0x11b711;
      sprintf((char *)pfVar13,"b0dy%d",uVar9 & 0xffffffff);
      doc = (fdb_doc **)((long)apfStack_29b0 + (long)pcVar14);
      ppfStack_2d18 = (fdb_doc **)0x11b729;
      fdb_doc_free(apfStack_29b0[uVar9]);
      ppfStack_2d18 = (fdb_doc **)0x11b731;
      pfVar8 = (fdb_kvs_handle *)strlen(doc_00);
      ppfStack_2d18 = (fdb_doc **)0x11b73c;
      sVar5 = strlen((char *)pfVar13);
      ppfStack_2d18 = (fdb_doc **)0x11b756;
      fdb_doc_create(doc,doc_00,(size_t)pfVar8,(void *)0x0,0,pfVar13,sVar5);
      ppfStack_2d18 = (fdb_doc **)0x11b768;
      fVar3 = fdb_set(pfStack_2d00,apfStack_29b0[uVar9]);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b9da;
      uVar9 = uVar9 + 1;
      pcVar14 = (char *)((long)pcVar14 + 8);
    } while (uVar9 != 0xfa);
    ppfStack_2d18 = (fdb_doc **)0x11b790;
    fVar3 = fdb_commit(pfStack_2cf8,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ba11;
    ppfStack_2d18 = (fdb_doc **)0x11b7b8;
    fdb_iterator_init(pfStack_2ce0,&pfStack_2cf0,(void *)0x0,0,(void *)0x0,0,2);
    pcVar14 = (char *)0x1ea;
    pfVar8 = afStack_1a10;
    doc_00 = (char *)&pfStack_2ce8;
    do {
      ppfStack_2d18 = (fdb_doc **)0x11b7d8;
      fVar3 = fdb_get_byoffset(pfStack_2d00,*(fdb_doc **)&pfVar8->kvs_config);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b9e4;
      ppfStack_2d18 = (fdb_doc **)0x11b7f6;
      fVar3 = fdb_iterator_seek(pfStack_2cf0,(void *)(*(size_t **)&pfVar8->kvs_config)[4],
                                **(size_t **)&pfVar8->kvs_config,'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b9df;
      ppfStack_2d18 = (fdb_doc **)0x11b80b;
      fVar3 = fdb_iterator_get(pfStack_2cf0,(fdb_doc **)doc_00);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b9ee;
      if (*pfStack_2ce8->body != *(long *)(*(long *)&pfVar8->kvs_config + 0x30)) {
        ppfStack_2d18 = (fdb_doc **)0x11b86c;
        iterator_offset_access_test();
      }
      ppfStack_2d18 = (fdb_doc **)0x11b835;
      fVar3 = fdb_del(pfStack_2d00,*(fdb_doc **)&pfVar8->kvs_config);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b9e9;
      ppfStack_2d18 = (fdb_doc **)0x11b84a;
      fdb_get_metaonly(pfStack_2d00,*(fdb_doc **)&pfVar8->kvs_config);
      pcVar14 = (char *)((long)pcVar14 + 10);
      pfVar8 = (fdb_kvs_handle *)&pfVar8->dhandle;
    } while (pcVar14 < (fdb_doc **)0x3de);
    ppfStack_2d18 = (fdb_doc **)0x11b878;
    fdb_iterator_close(pfStack_2cf0);
    ppfStack_2d18 = (fdb_doc **)0x11b887;
    fVar3 = fdb_commit(pfStack_2cf8,'\x01');
    if (fVar3 == FDB_RESULT_SUCCESS) {
      doc_00 = (char *)apfStack_2cb0;
      pcVar14 = "b1dy%d";
      pfVar13 = (fdb_kvs_handle *)auStack_2bb0;
      doc = (fdb_doc **)0x0;
      do {
        ppfStack_2d18 = (fdb_doc **)0x11b8b8;
        sprintf(doc_00,"k1y%d",doc);
        ppfStack_2d18 = (fdb_doc **)0x11b8c7;
        sprintf((char *)pfVar13,"b1dy%d",doc);
        pfVar2 = pfStack_2d00;
        ppfStack_2d18 = (fdb_doc **)0x11b8d4;
        pfVar8 = (fdb_kvs_handle *)strlen(doc_00);
        ppfStack_2d18 = (fdb_doc **)0x11b8df;
        sVar5 = strlen((char *)pfVar13);
        ppfStack_2d18 = (fdb_doc **)0x11b8f3;
        fVar3 = fdb_set_kv(pfVar2,doc_00,(size_t)pfVar8,pfVar13,sVar5);
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b9f3;
        uVar12 = (int)doc + 1;
        doc = (fdb_doc **)(ulong)uVar12;
      } while (uVar12 != 0xfa);
      doc_00 = (char *)0x1ea;
      pfVar8 = afStack_1a10;
      while( true ) {
        ppfStack_2d18 = (fdb_doc **)0x11b920;
        fVar3 = fdb_get_byoffset(pfStack_2d00,*(fdb_doc **)&pfVar8->kvs_config);
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) break;
        if (*(char *)(*(long *)&pfVar8->kvs_config + 0x48) == '\0') {
          ppfStack_2d18 = (fdb_doc **)0x11b94d;
          iterator_offset_access_test();
        }
        doc_00 = (char *)((long)doc_00 + 10);
        pfVar8 = (fdb_kvs_handle *)&pfVar8->dhandle;
        if ((fdb_doc **)0x3dd < doc_00) {
          lVar15 = 0;
          do {
            ppfStack_2d18 = (fdb_doc **)0x11b95e;
            fdb_doc_free(apfStack_29b0[lVar15]);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 1000);
          ppfStack_2d18 = (fdb_doc **)0x11b974;
          fdb_doc_free(pfStack_2ce8);
          ppfStack_2d18 = (fdb_doc **)0x11b97e;
          fdb_close(pfStack_2cf8);
          ppfStack_2d18 = (fdb_doc **)0x11b983;
          fdb_shutdown();
          ppfStack_2d18 = (fdb_doc **)0x11b988;
          memleak_end();
          pcVar14 = "%s PASSED\n";
          if (iterator_offset_access_test()::__test_pass != '\0') {
            pcVar14 = "%s FAILED\n";
          }
          ppfStack_2d18 = (fdb_doc **)0x11b9b9;
          fprintf(_stderr,pcVar14,"iterator offset access test");
          return;
        }
      }
LAB_0011b9f8:
      ppfStack_2d18 = (fdb_doc **)0x11b9fd;
      iterator_offset_access_test();
      goto LAB_0011b9fd;
    }
  }
  else {
LAB_0011b9fd:
    ppfStack_2d18 = (fdb_doc **)0x11ba02;
    iterator_offset_access_test();
LAB_0011ba02:
    ppfStack_2d18 = (fdb_doc **)0x11ba07;
    iterator_offset_access_test();
LAB_0011ba07:
    ppfStack_2d18 = (fdb_doc **)0x11ba0c;
    iterator_offset_access_test();
LAB_0011ba0c:
    ppfStack_2d18 = (fdb_doc **)0x11ba11;
    iterator_offset_access_test();
LAB_0011ba11:
    ppfStack_2d18 = (fdb_doc **)0x11ba16;
    iterator_offset_access_test();
  }
  ppfStack_2d18 = (fdb_doc **)iterator_deleted_doc_right_before_the_end_test;
  iterator_offset_access_test();
  ppfStack_31a0 = (fdb_iterator **)0x11ba36;
  pfStack_2d38 = pfVar8;
  pfStack_2d30 = pfVar13;
  ppfStack_2d28 = (fdb_doc **)doc_00;
  ppfStack_2d20 = (fdb_doc **)pcVar14;
  ppfStack_2d18 = doc;
  gettimeofday(&tStack_3168,(__timezone_ptr_t)0x0);
  ppfStack_31a0 = (fdb_iterator **)0x11ba3b;
  memleak_start();
  ppfStack_31a0 = (fdb_iterator **)0x11ba4b;
  fdb_get_default_config();
  fStack_2f30.buffercache_size = 0;
  ppfStack_31a0 = (fdb_iterator **)0x11ba63;
  fdb_get_default_kvs_config();
  ppfStack_31a0 = (fdb_iterator **)0x11ba86;
  sprintf(acStack_3038,"rm -rf  %s*","./dummy");
  ppfStack_31a0 = (fdb_iterator **)0x11ba8e;
  system(acStack_3038);
  ppfStack_31a0 = (fdb_iterator **)0x11baa1;
  fdb_open(&pfStack_3170,"./dummy",&fStack_2f30);
  ppfStack_31a0 = (fdb_iterator **)0x11bab4;
  fdb_kvs_open(pfStack_3170,&pfStack_3178,(char *)0x0,&fStack_3050);
  uVar9 = 0;
  do {
    ppfStack_31a0 = (fdb_iterator **)0x11bae0;
    sprintf((char *)apfStack_3158,"k%06d\n",uVar9);
    ppfStack_31a0 = (fdb_iterator **)0x11baef;
    sprintf(acStack_2e38,"v%06d\n",uVar9);
    ppfStack_31a0 = (fdb_iterator **)0x11bb0a;
    fdb_set_kv(pfStack_3178,apfStack_3158,8,acStack_2e38,8);
    uVar12 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar12;
  } while (uVar12 != 3);
  ppfStack_31a0 = (fdb_iterator **)0x11bb2c;
  sprintf((char *)apfStack_3158,"k%06d\n",1);
  ppfStack_31a0 = (fdb_iterator **)0x11bb3e;
  fdb_del_kv(pfStack_3178,apfStack_3158,8);
  ppfStack_31a0 = (fdb_iterator **)0x11bb4a;
  fdb_commit(pfStack_3170,'\0');
  apfStack_3158[0]._0_2_ = 0x61;
  acStack_3038[0] = 'z';
  acStack_3038[1] = '\0';
  ppfStack_31a0 = (fdb_iterator **)0x11bb81;
  fVar3 = fdb_iterator_init(pfStack_3178,&pfStack_3188,apfStack_3158,1,acStack_3038,1,2);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfStack_31a0 = (fdb_iterator **)0x11bb93;
    fVar3 = fdb_iterator_seek_to_max(pfStack_3188);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bdbc;
    pfStack_3180 = (fdb_doc *)0x0;
    ppfStack_31a0 = (fdb_iterator **)0x11bbb1;
    fVar3 = fdb_iterator_get(pfStack_3188,&pfStack_3180);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bdc1;
    ppfStack_31a0 = (fdb_iterator **)0x11bbd4;
    sprintf((char *)apfStack_3158,"k%06d\n",2);
    if (*pfStack_3180->key != CONCAT62(apfStack_3158[0]._2_6_,apfStack_3158[0]._0_2_))
    goto LAB_0011bdc6;
    ppfStack_31a0 = (fdb_iterator **)0x11bbee;
    fdb_doc_free(pfStack_3180);
    ppfStack_31a0 = (fdb_iterator **)0x11bbf8;
    fVar3 = fdb_iterator_prev(pfStack_3188);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bdd0;
    pfStack_3180 = (fdb_doc *)0x0;
    ppfStack_31a0 = (fdb_iterator **)0x11bc16;
    fVar3 = fdb_iterator_get(pfStack_3188,&pfStack_3180);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bdd5;
    ppfStack_31a0 = (fdb_iterator **)0x11bc36;
    sprintf((char *)apfStack_3158,"k%06d\n",0);
    if (*pfStack_3180->key != CONCAT62(apfStack_3158[0]._2_6_,apfStack_3158[0]._0_2_))
    goto LAB_0011bdda;
    ppfStack_31a0 = (fdb_iterator **)0x11bc50;
    fdb_doc_free(pfStack_3180);
    ptr_iterator_01 = &pfStack_3188;
    ppfStack_31a0 = (fdb_iterator **)0x11bc5d;
    fdb_iterator_close(pfStack_3188);
    ppfStack_31a0 = (fdb_iterator **)0x11bc89;
    fVar3 = fdb_iterator_init(pfStack_3178,ptr_iterator_01,apfStack_3158,1,acStack_3038,1,2);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bde4;
    ppfStack_31a0 = (fdb_iterator **)0x11bc9b;
    fVar3 = fdb_iterator_seek_to_min(pfStack_3188);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bde9;
    pfStack_3180 = (fdb_doc *)0x0;
    ppfStack_31a0 = (fdb_iterator **)0x11bcb9;
    fVar3 = fdb_iterator_get(pfStack_3188,&pfStack_3180);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bdee;
    ptr_iterator_01 = apfStack_3158;
    ppfStack_31a0 = (fdb_iterator **)0x11bcd9;
    sprintf((char *)ptr_iterator_01,"k%06d\n",0);
    if (*pfStack_3180->key != CONCAT62(apfStack_3158[0]._2_6_,apfStack_3158[0]._0_2_))
    goto LAB_0011bdf3;
    ppfStack_31a0 = (fdb_iterator **)0x11bcf3;
    fdb_doc_free(pfStack_3180);
    ppfStack_31a0 = (fdb_iterator **)0x11bcfd;
    fVar3 = fdb_iterator_next(pfStack_3188);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bdfd;
    pfStack_3180 = (fdb_doc *)0x0;
    ppfStack_31a0 = (fdb_iterator **)0x11bd1b;
    fVar3 = fdb_iterator_get(pfStack_3188,&pfStack_3180);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011be02;
    ptr_iterator_01 = apfStack_3158;
    ppfStack_31a0 = (fdb_iterator **)0x11bd3e;
    sprintf((char *)ptr_iterator_01,"k%06d\n",2);
    if (*pfStack_3180->key == CONCAT62(apfStack_3158[0]._2_6_,apfStack_3158[0]._0_2_)) {
      ppfStack_31a0 = (fdb_iterator **)0x11bd58;
      fdb_doc_free(pfStack_3180);
      ppfStack_31a0 = (fdb_iterator **)0x11bd62;
      fdb_iterator_close(pfStack_3188);
      ppfStack_31a0 = (fdb_iterator **)0x11bd6c;
      fdb_close(pfStack_3170);
      ppfStack_31a0 = (fdb_iterator **)0x11bd71;
      fdb_shutdown();
      ppfStack_31a0 = (fdb_iterator **)0x11bd76;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (iterator_deleted_doc_right_before_the_end_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      ppfStack_31a0 = (fdb_iterator **)0x11bda7;
      fprintf(_stderr,pcVar14,"iterator deleted doc right before the end of iteration test");
      return;
    }
  }
  else {
    ppfStack_31a0 = (fdb_iterator **)0x11bdbc;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdbc:
    ppfStack_31a0 = (fdb_iterator **)0x11bdc1;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdc1:
    ppfStack_31a0 = (fdb_iterator **)0x11bdc6;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdc6:
    ppfStack_31a0 = (fdb_iterator **)0x11bdd0;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdd0:
    ppfStack_31a0 = (fdb_iterator **)0x11bdd5;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdd5:
    ppfStack_31a0 = (fdb_iterator **)0x11bdda;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdda:
    ptr_iterator_01 = apfStack_3158;
    ppfStack_31a0 = (fdb_iterator **)0x11bde4;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bde4:
    ppfStack_31a0 = (fdb_iterator **)0x11bde9;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bde9:
    ppfStack_31a0 = (fdb_iterator **)0x11bdee;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdee:
    ppfStack_31a0 = (fdb_iterator **)0x11bdf3;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdf3:
    ppfStack_31a0 = (fdb_iterator **)0x11bdfd;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdfd:
    ppfStack_31a0 = (fdb_iterator **)0x11be02;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011be02:
    ppfStack_31a0 = (fdb_iterator **)0x11be07;
    iterator_deleted_doc_right_before_the_end_test();
  }
  ppfStack_31a0 = (fdb_iterator **)iterator_uncommited_seeks;
  iterator_deleted_doc_right_before_the_end_test();
  pcStack_32f8 = (code *)0x11be25;
  ppfStack_31a0 = ptr_iterator_01;
  gettimeofday(&tStack_32a8,(__timezone_ptr_t)0x0);
  pfStack_32e0 = (fdb_doc *)0x0;
  pcStack_32f8 = (code *)0x11be33;
  memleak_start();
  pfVar11 = &fStack_3298;
  pcStack_32f8 = (code *)0x11be40;
  fdb_get_default_config();
  pcStack_32f8 = (code *)0x11be4a;
  fdb_get_default_kvs_config();
  pcStack_32f8 = (code *)0x11be56;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcStack_32f8 = (code *)0x11be6a;
  fVar3 = fdb_open(&pfStack_32c8,"./iterator_test1",pfVar11);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_32f8 = (code *)0x11be86;
    fVar3 = fdb_kvs_open_default(pfStack_32c8,&pfStack_32d0,&fStack_32c0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c091;
    pcStack_32f8 = (code *)0x11bea9;
    fdb_set_kv(pfStack_32d0,"a",1,(void *)0x0,0);
    pfVar11 = (fdb_config *)0x155b95;
    pcStack_32f8 = (code *)0x11bec7;
    fdb_set_kv(pfStack_32d0,"b",1,(void *)0x0,0);
    pcStack_32f8 = (code *)0x11bee2;
    fdb_set_kv(pfStack_32d0,"c",1,(void *)0x0,0);
    pcStack_32f8 = (code *)0x11bf06;
    fVar3 = fdb_iterator_init(pfStack_32d0,&pfStack_32d8,"b",1,(void *)0x0,0,0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c098;
    pcStack_32f8 = (code *)0x11bf18;
    fVar3 = fdb_iterator_seek_to_min(pfStack_32d8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c09d;
    pcStack_32f8 = (code *)0x11bf2f;
    fVar3 = fdb_iterator_get(pfStack_32d8,&pfStack_32e0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c0a4;
    if (*pfStack_32e0->key != 'b') goto LAB_0011c0ab;
    pcStack_32f8 = (code *)0x11bf4e;
    fdb_doc_free(pfStack_32e0);
    pfStack_32e0 = (fdb_doc *)0x0;
    pcStack_32f8 = (code *)0x11bf61;
    fVar3 = fdb_iterator_seek_to_max(pfStack_32d8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c0b3;
    pcStack_32f8 = (code *)0x11bf78;
    fVar3 = fdb_iterator_get(pfStack_32d8,&pfStack_32e0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c0ba;
    if (*pfStack_32e0->key != 'c') goto LAB_0011c0c1;
    pcStack_32f8 = (code *)0x11bf97;
    fdb_doc_free(pfStack_32e0);
    pfStack_32e0 = (fdb_doc *)0x0;
    pcStack_32f8 = (code *)0x11bfaa;
    fVar3 = fdb_iterator_prev(pfStack_32d8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c0c9;
    pcStack_32f8 = (code *)0x11bfc1;
    fVar3 = fdb_iterator_get(pfStack_32d8,&pfStack_32e0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c0d0;
    if (*pfStack_32e0->key != 'b') goto LAB_0011c0d7;
    pcStack_32f8 = (code *)0x11bfe0;
    fdb_doc_free(pfStack_32e0);
    pfStack_32e0 = (fdb_doc *)0x0;
    pcStack_32f8 = (code *)0x11bff3;
    fVar3 = fdb_iterator_next(pfStack_32d8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c0df;
    pcStack_32f8 = (code *)0x11c00a;
    fVar3 = fdb_iterator_get(pfStack_32d8,&pfStack_32e0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c0e6;
    if (*pfStack_32e0->key == 'c') {
      pcStack_32f8 = (code *)0x11c029;
      fdb_doc_free(pfStack_32e0);
      pfStack_32e0 = (fdb_doc *)0x0;
      pcStack_32f8 = (code *)0x11c03c;
      fdb_iterator_close(pfStack_32d8);
      pcStack_32f8 = (code *)0x11c046;
      fdb_close(pfStack_32c8);
      pcStack_32f8 = (code *)0x11c04b;
      fdb_shutdown();
      pcStack_32f8 = (code *)0x11c050;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (iterator_uncommited_seeks()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pcStack_32f8 = (code *)0x11c081;
      fprintf(_stderr,pcVar14,"iterator single doc range");
      return;
    }
  }
  else {
    pcStack_32f8 = (code *)0x11c091;
    iterator_uncommited_seeks();
LAB_0011c091:
    pcStack_32f8 = (code *)0x11c098;
    iterator_uncommited_seeks();
LAB_0011c098:
    pcStack_32f8 = (code *)0x11c09d;
    iterator_uncommited_seeks();
LAB_0011c09d:
    pcStack_32f8 = (code *)0x11c0a4;
    iterator_uncommited_seeks();
LAB_0011c0a4:
    pcStack_32f8 = (code *)0x11c0ab;
    iterator_uncommited_seeks();
LAB_0011c0ab:
    pcStack_32f8 = (code *)0x11c0b3;
    iterator_uncommited_seeks();
LAB_0011c0b3:
    pcStack_32f8 = (code *)0x11c0ba;
    iterator_uncommited_seeks();
LAB_0011c0ba:
    pcStack_32f8 = (code *)0x11c0c1;
    iterator_uncommited_seeks();
LAB_0011c0c1:
    pcStack_32f8 = (code *)0x11c0c9;
    iterator_uncommited_seeks();
LAB_0011c0c9:
    pcStack_32f8 = (code *)0x11c0d0;
    iterator_uncommited_seeks();
LAB_0011c0d0:
    pcStack_32f8 = (code *)0x11c0d7;
    iterator_uncommited_seeks();
LAB_0011c0d7:
    pcStack_32f8 = (code *)0x11c0df;
    iterator_uncommited_seeks();
LAB_0011c0df:
    pcStack_32f8 = (code *)0x11c0e6;
    iterator_uncommited_seeks();
LAB_0011c0e6:
    pcStack_32f8 = (code *)0x11c0ed;
    iterator_uncommited_seeks();
  }
  pcStack_32f8 = iterator_init_using_substring_test;
  iterator_uncommited_seeks();
  pfStack_36a0 = (fdb_config *)0x11c10f;
  pfStack_3308 = pfVar11;
  pcStack_3300 = (char *)apfStack_3158;
  pcStack_32f8 = (code *)uVar9;
  gettimeofday(&tStack_3618,(__timezone_ptr_t)0x0);
  pfStack_36a0 = (fdb_config *)0x11c114;
  memleak_start();
  pfVar11 = &fStack_3500;
  pfStack_36a0 = (fdb_config *)0x11c124;
  fdb_get_default_config();
  fStack_3500.buffercache_size = 0;
  pfStack_36a0 = (fdb_config *)0x11c136;
  fdb_get_default_kvs_config();
  pfStack_36a0 = (fdb_config *)0x11c156;
  sprintf(acStack_3408,"rm -rf  %s*","./iterator_test");
  pfStack_36a0 = (fdb_config *)0x11c15e;
  system(acStack_3408);
  pfStack_36a0 = (fdb_config *)0x11c172;
  fVar3 = fdb_open(&pfStack_3678,"./iterator_test1",pfVar11);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_36a0 = (fdb_config *)0x11c190;
    fVar3 = fdb_kvs_open(pfStack_3678,&pfStack_3680,(char *)0x0,&fStack_3630);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c32a;
    uStack_3640 = 0x34323634353773;
    uStack_3639 = 0xff;
    uStack_3658 = 0x34323634353773;
    uStack_3651 = 0x10000ff;
    uStack_3648._0_4_ = 0x34353773;
    uStack_3648._4_1_ = true;
    uStack_3648._5_1_ = true;
    uStack_3648._6_1_ = '4';
    uStack_3648._7_1_ = 0xff;
    uStack_3668 = 0xff34323634353773;
    uStack_3660 = 0xff;
    uStack_3608 = 0x3179656b;
    uStack_3604 = 0;
    pfStack_36a0 = (fdb_config *)0x11c1f4;
    fVar3 = fdb_set_kv(pfStack_3680,&uStack_3640,0xb,&uStack_3608,4);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c32f;
    uStack_3604 = 0;
    uStack_3608 = 0x3279656b;
    pfStack_36a0 = (fdb_config *)0x11c228;
    fVar3 = fdb_set_kv(pfStack_3680,&uStack_3658,0xb,&uStack_3608,4);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c334;
    pfStack_36a0 = (fdb_config *)0x11c23f;
    fVar3 = fdb_commit(pfStack_3678,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c339;
    pfStack_36a0 = (fdb_config *)0x11c272;
    fVar3 = fdb_iterator_init(pfStack_3680,&pfStack_3688,&uStack_3648,8,&uStack_3668,9,10);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c33e;
    iVar4 = 0;
    pfVar11 = (fdb_config *)&pfStack_3670;
    do {
      pfStack_3670 = (fdb_doc *)0x0;
      pfStack_36a0 = (fdb_config *)0x11c297;
      fVar3 = fdb_iterator_get(pfStack_3688,(fdb_doc **)pfVar11);
      if (fVar3 != FDB_RESULT_SUCCESS) break;
      iVar4 = iVar4 + 1;
      pfStack_36a0 = (fdb_config *)0x11c2a7;
      fdb_doc_free(pfStack_3670);
      pfStack_36a0 = (fdb_config *)0x11c2b1;
      fVar3 = fdb_iterator_next(pfStack_3688);
    } while (fVar3 == FDB_RESULT_SUCCESS);
    if (iVar4 != 2) goto LAB_0011c343;
    pfStack_36a0 = (fdb_config *)0x11c2c8;
    fVar3 = fdb_iterator_close(pfStack_3688);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c348;
    pfStack_36a0 = (fdb_config *)0x11c2d6;
    fVar3 = fdb_close(pfStack_3678);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c34d;
    pfStack_36a0 = (fdb_config *)0x11c2df;
    fVar3 = fdb_shutdown();
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_36a0 = (fdb_config *)0x11c2e8;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (iterator_init_using_substring_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pfStack_36a0 = (fdb_config *)0x11c319;
      fprintf(_stderr,pcVar14,"iterator init using substring test");
      return;
    }
  }
  else {
    pfStack_36a0 = (fdb_config *)0x11c32a;
    iterator_init_using_substring_test();
LAB_0011c32a:
    pfStack_36a0 = (fdb_config *)0x11c32f;
    iterator_init_using_substring_test();
LAB_0011c32f:
    pfStack_36a0 = (fdb_config *)0x11c334;
    iterator_init_using_substring_test();
LAB_0011c334:
    pfStack_36a0 = (fdb_config *)0x11c339;
    iterator_init_using_substring_test();
LAB_0011c339:
    pfStack_36a0 = (fdb_config *)0x11c33e;
    iterator_init_using_substring_test();
LAB_0011c33e:
    pfStack_36a0 = (fdb_config *)0x11c343;
    iterator_init_using_substring_test();
LAB_0011c343:
    pfStack_36a0 = (fdb_config *)0x11c348;
    iterator_init_using_substring_test();
LAB_0011c348:
    pfStack_36a0 = (fdb_config *)0x11c34d;
    iterator_init_using_substring_test();
LAB_0011c34d:
    pfStack_36a0 = (fdb_config *)0x11c352;
    iterator_init_using_substring_test();
  }
  pfStack_36a0 = (fdb_config *)iterator_seek_to_max_key_with_deletes_test;
  iterator_init_using_substring_test();
  pfStack_37f8 = (fdb_config *)0x11c36d;
  pfStack_36a0 = pfVar11;
  gettimeofday(&tStack_37a8,(__timezone_ptr_t)0x0);
  pfStack_37f8 = (fdb_config *)0x11c372;
  memleak_start();
  pfStack_37e0 = (fdb_iterator *)0x0;
  pfStack_37d0 = (fdb_doc *)0x0;
  pfVar11 = &fStack_3798;
  pfStack_37f8 = (fdb_config *)0x11c389;
  fdb_get_default_config();
  pfStack_37f8 = (fdb_config *)0x11c393;
  fdb_get_default_kvs_config();
  pfStack_37f8 = (fdb_config *)0x11c39f;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfStack_37f8 = (fdb_config *)0x11c3b3;
  fVar3 = fdb_open(&pfStack_37c8,"./iterator_test1",pfVar11);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_37f8 = (fdb_config *)0x11c3cf;
    fVar3 = fdb_kvs_open_default(pfStack_37c8,&pfStack_37d8,&fStack_37c0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c58c;
    pfStack_37f8 = (fdb_config *)0x11c3f2;
    fdb_set_kv(pfStack_37d8,"A",1,(void *)0x0,0);
    pfVar11 = (fdb_config *)0x155dcc;
    pfStack_37f8 = (fdb_config *)0x11c410;
    fdb_set_kv(pfStack_37d8,"B",1,(void *)0x0,0);
    pfStack_37f8 = (fdb_config *)0x11c43b;
    fVar3 = fdb_iterator_init(pfStack_37d8,&pfStack_37e0,"B",1,"Bzz",3,0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c593;
    pfStack_37f8 = (fdb_config *)0x11c44d;
    fVar3 = fdb_iterator_seek_to_max(pfStack_37e0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c598;
    pfStack_37f8 = (fdb_config *)0x11c464;
    fVar3 = fdb_iterator_get(pfStack_37e0,&pfStack_37d0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c59f;
    if (*pfStack_37d0->key != 'B') goto LAB_0011c5a6;
    pfStack_37f8 = (fdb_config *)0x11c483;
    fdb_doc_free(pfStack_37d0);
    pfStack_37d0 = (fdb_doc *)0x0;
    pfStack_37f8 = (fdb_config *)0x11c496;
    fVar3 = fdb_iterator_close(pfStack_37e0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c5ae;
    pfStack_37e0 = (fdb_iterator *)0x0;
    pfStack_37f8 = (fdb_config *)0x11c4bd;
    fVar3 = fdb_del_kv(pfStack_37d8,"B",1);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c5b5;
    pfStack_37f8 = (fdb_config *)0x11c4f4;
    fVar3 = fdb_iterator_init(pfStack_37d8,&pfStack_37e0,"B",1,"Bzz",3,0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c5bc;
    pfStack_37f8 = (fdb_config *)0x11c50b;
    fVar3 = fdb_iterator_get(pfStack_37e0,&pfStack_37d0);
    if (fVar3 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c5c1;
    pfStack_37f8 = (fdb_config *)0x11c51e;
    fVar3 = fdb_iterator_seek_to_max(pfStack_37e0);
    if (fVar3 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c5c6;
    pfStack_37f8 = (fdb_config *)0x11c531;
    fVar3 = fdb_close(pfStack_37c8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c5cb;
    pfStack_37f8 = (fdb_config *)0x11c53e;
    fVar3 = fdb_shutdown();
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_37f8 = (fdb_config *)0x11c54b;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (iterator_seek_to_max_key_with_deletes_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pfStack_37f8 = (fdb_config *)0x11c57c;
      fprintf(_stderr,pcVar14,"iterator seek to max test");
      return;
    }
  }
  else {
    pfStack_37f8 = (fdb_config *)0x11c58c;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c58c:
    pfStack_37f8 = (fdb_config *)0x11c593;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c593:
    pfStack_37f8 = (fdb_config *)0x11c598;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c598:
    pfStack_37f8 = (fdb_config *)0x11c59f;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c59f:
    pfStack_37f8 = (fdb_config *)0x11c5a6;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5a6:
    pfStack_37f8 = (fdb_config *)0x11c5ae;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5ae:
    pfStack_37f8 = (fdb_config *)0x11c5b5;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5b5:
    pfStack_37f8 = (fdb_config *)0x11c5bc;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5bc:
    pfStack_37f8 = (fdb_config *)0x11c5c1;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5c1:
    pfStack_37f8 = (fdb_config *)0x11c5c6;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5c6:
    pfStack_37f8 = (fdb_config *)0x11c5cb;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5cb:
    pfStack_37f8 = (fdb_config *)0x11c5d2;
    iterator_seek_to_max_key_with_deletes_test();
  }
  pfStack_37f8 = (fdb_config *)iterator_seek_to_min_key_with_deletes_test;
  iterator_seek_to_max_key_with_deletes_test();
  pfStack_37f8 = pfVar11;
  gettimeofday(&tStack_3900,(__timezone_ptr_t)0x0);
  memleak_start();
  pfStack_3938 = (fdb_iterator *)0x0;
  pfStack_3920 = (fdb_doc *)0x0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fVar3 = fdb_open(&pfStack_3928,"./iterator_test1",&fStack_38f0);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_kvs_open_default(pfStack_3928,&pfStack_3930,&fStack_3918);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c779;
    fdb_set_kv(pfStack_3930,"B",1,(void *)0x0,0);
    fdb_set_kv(pfStack_3930,"C",1,(void *)0x0,0);
    fVar3 = fdb_del_kv(pfStack_3930,"B",1);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c780;
    fVar3 = fdb_iterator_init(pfStack_3930,&pfStack_3938,"A",1,"B",1,0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c787;
    fVar3 = fdb_iterator_get(pfStack_3938,&pfStack_3920);
    if (fVar3 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c78c;
    fVar3 = fdb_iterator_seek_to_min(pfStack_3938);
    if (fVar3 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c791;
    fVar3 = fdb_iterator_close(pfStack_3938);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c796;
    fVar3 = fdb_close(pfStack_3928);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_shutdown();
      if (fVar3 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar14 = "%s PASSED\n";
        if (iterator_seek_to_min_key_with_deletes_test()::__test_pass != '\0') {
          pcVar14 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar14,"iterator seek to min test");
        return;
      }
      goto LAB_0011c7a4;
    }
  }
  else {
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c779:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c780:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c787:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c78c:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c791:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c796:
    iterator_seek_to_min_key_with_deletes_test();
  }
  iterator_seek_to_min_key_with_deletes_test();
LAB_0011c7a4:
  iterator_seek_to_min_key_with_deletes_test();
  iterator_test();
  iterator_with_concurrent_updates_test();
  iterator_compact_uncommitted_db();
  iterator_seek_test();
  iVar4 = 0;
  do {
    delete_opt = 0;
    do {
      iterator_complete_test(iVar4,delete_opt);
      delete_opt = delete_opt + 1;
    } while (delete_opt == 1);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 7);
  iterator_extreme_key_test();
  iterator_inmem_snapshot_seek_test(false);
  iterator_inmem_snapshot_seek_test(true);
  iterator_no_deletes_test();
  iterator_set_del_docs_test();
  iterator_del_next_test();
  sequence_iterator_test();
  sequence_iterator_duplicate_test();
  sequence_iterator_range_test();
  reverse_seek_to_max_nokey();
  reverse_sequence_iterator_test();
  reverse_sequence_iterator_kvs_test();
  reverse_iterator_test();
  iterator_seek_wal_only_test();
  iterator_after_wal_threshold();
  iterator_manual_wal_flush();
  sequence_iterator_seek_test(true);
  sequence_iterator_seek_test(false);
  iterator_concurrent_compaction();
  iterator_offset_access_test();
  iterator_deleted_doc_right_before_the_end_test();
  iterator_uncommited_seeks();
  iterator_init_using_substring_test();
  iterator_seek_to_max_key_with_deletes_test();
  iterator_seek_to_min_key_with_deletes_test();
  return;
}

Assistant:

void iterator_manual_wal_flush()
{
    TEST_INIT();
    memleak_start();

    int r;
    unsigned char key1[] =       { 8,  5, 62, 62, 52, 50, 48, 49,
                                  45,  0,  6, 49,  0,  0,  0};
    unsigned char key2[] =       { 8,  5, 62, 62, 52, 50, 48, 49,
                                  49, 45,  0,  6, 49, 50,  0,  0,
                                   0};
    unsigned char start_key1[] = { 8,  5, 62, 62, 52, 49, 57, 57,
                                  57, 45,  0};
    unsigned char start_key2[] = { 8,  5, 62, 62, 52, 51, 52, 53,
                                  10, 20,  0};
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *db2;
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *it;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db1", &kvs_config);
    fdb_kvs_open(dbfile, &db2, "db2", &kvs_config);

    fdb_set_kv(db, key1, sizeof(key1), NULL, 0);
    fdb_set_kv(db, key2, sizeof(key2), NULL, 0);

    // normal commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // start_key's skipped prefix is smaller than the common prefix
    status = fdb_iterator_init(db, &it, start_key1, sizeof(start_key1),
                               NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    do {
        status = fdb_iterator_get(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);

    // start_key's skipped prefix is gerater than the common prefix
    status = fdb_iterator_init(db, &it, start_key2, sizeof(start_key2),
                               NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(it, &rdoc);
    TEST_CHK(status != FDB_RESULT_SUCCESS);
    fdb_iterator_close(it);

    fdb_set_kv(db2, key1, sizeof(key1), NULL, 0);
    fdb_set_kv(db2, key2, sizeof(key2), NULL, 0);

    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // start_key's skipped prefix is smaller than the common prefix
    status = fdb_iterator_init(db2, &it, start_key1, sizeof(start_key1),
                               NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    do {
        status = fdb_iterator_get(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);

    // start_key's skipped prefix is gerater than the common prefix
    status = fdb_iterator_init(db, &it, start_key2, sizeof(start_key2),
                               NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(it, &rdoc);
    TEST_CHK(status != FDB_RESULT_SUCCESS);
    fdb_iterator_close(it);

    // start_key's skipped prefix is smaller than the common prefix
    status = fdb_iterator_init(db2, &it, NULL, 0,
                               start_key1, sizeof(start_key1), FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_seek(it, start_key1, sizeof(start_key1), FDB_ITR_SEEK_LOWER);
    TEST_CHK(status != FDB_RESULT_SUCCESS);
    fdb_iterator_close(it);

    // start_key's skipped prefix is gerater than the common prefix
    status = fdb_iterator_init(db, &it, NULL, 0,
                               start_key2, sizeof(start_key2), FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_seek(it, start_key2, sizeof(start_key2), FDB_ITR_SEEK_LOWER);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(it, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);
    rdoc = NULL;
    while (fdb_iterator_prev(it) != FDB_RESULT_ITERATOR_FAIL) {
        status = fdb_iterator_get(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }
    fdb_iterator_close(it);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("iterator manual wal flush");
}